

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

int __thiscall CEditorMap::Load(CEditorMap *this,IStorage *pStorage,char *pFileName,int StorageType)

{
  uchar uVar1;
  long lVar2;
  IGraphics *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  CEditorImage *this_00;
  void *pvVar11;
  void *pvVar12;
  CLayerGroup *this_01;
  CLayerTiles *this_02;
  CTile *pSavedTiles;
  ulong uVar13;
  CEnvelope *this_03;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  undefined4 *puVar21;
  undefined4 *puVar22;
  CMapItemLayerQuads *pQuadsItem;
  uint uVar23;
  long in_FS_OFFSET;
  byte bVar24;
  void *local_418;
  CEditorImage *pImg;
  int Num;
  int Start;
  CDataFileReader DataFile;
  CEditorImage ImgInfo;
  char aBuf [512];
  
  bVar24 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  DataFile.m_pDataFile = (CDatafile *)0x0;
  bVar6 = CDataFileReader::Open(&DataFile,pStorage,pFileName,StorageType);
  iVar8 = 0;
  if (bVar6) {
    Clean(this);
    piVar9 = (int *)CDataFileReader::FindItem(&DataFile,0,0);
    iVar8 = 0;
    if ((piVar9 != (int *)0x0) && (iVar8 = 0, *piVar9 == 1)) {
      piVar9 = (int *)CDataFileReader::FindItem(&DataFile,1,0);
      if ((piVar9 != (int *)0x0) && (*piVar9 == 1)) {
        if (-1 < piVar9[1]) {
          pcVar10 = (char *)CDataFileReader::GetData(&DataFile,piVar9[1]);
          str_copy((this->m_MapInfo).m_aAuthor,pcVar10,0x20);
        }
        if (-1 < piVar9[2]) {
          pcVar10 = (char *)CDataFileReader::GetData(&DataFile,piVar9[2]);
          str_copy((this->m_MapInfo).m_aVersion,pcVar10,0x10);
        }
        if (-1 < piVar9[3]) {
          pcVar10 = (char *)CDataFileReader::GetData(&DataFile,piVar9[3]);
          str_copy((this->m_MapInfo).m_aCredits,pcVar10,0x80);
        }
        if (-1 < piVar9[4]) {
          pcVar10 = (char *)CDataFileReader::GetData(&DataFile,piVar9[4]);
          str_copy((this->m_MapInfo).m_aLicense,pcVar10,0x20);
        }
      }
      CDataFileReader::GetType(&DataFile,2,&Start,&Num);
      for (iVar8 = 0; iVar8 < Num; iVar8 = iVar8 + 1) {
        piVar9 = (int *)CDataFileReader::GetItem(&DataFile,Start + iVar8,(int *)0x0,(int *)0x0);
        pcVar10 = (char *)CDataFileReader::GetData(&DataFile,piVar9[4]);
        this_00 = (CEditorImage *)operator_new(0x1b0);
        CEditorImage::CEditorImage(this_00,this->m_pEditor);
        iVar7 = piVar9[3];
        this_00->m_External = iVar7;
        pImg = this_00;
        if ((iVar7 == 0) && ((iVar7 = *piVar9, iVar7 < 2 || ((uint)piVar9[6] < 2)))) {
          iVar19 = piVar9[1];
          (this_00->super_CImageInfo).m_Width = iVar19;
          iVar15 = piVar9[2];
          (this_00->super_CImageInfo).m_Height = iVar15;
          iVar14 = 1;
          if (iVar7 != 1) {
            iVar14 = piVar9[6];
          }
          (this_00->super_CImageInfo).m_Format = iVar14;
          iVar7 = CImageInfo::GetPixelSize((CImageInfo *)this_00);
          pvVar11 = CDataFileReader::GetData(&DataFile,piVar9[5]);
          uVar23 = iVar15 * iVar19 * iVar7;
          pvVar12 = mem_alloc(uVar23);
          (pImg->super_CImageInfo).m_pData = pvVar12;
          mem_copy(pvVar12,pvVar11,uVar23);
          pIVar3 = this->m_pEditor->m_pGraphics;
          iVar7 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
                            (pIVar3,(ulong)(uint)(pImg->super_CImageInfo).m_Width,
                             (ulong)(uint)(pImg->super_CImageInfo).m_Height,
                             (ulong)(uint)(pImg->super_CImageInfo).m_Format,
                             (pImg->super_CImageInfo).m_pData,0xffffffffffffffff,8);
          (pImg->m_Texture).m_Id = iVar7;
        }
        else {
          str_format(aBuf,0x200,"mapres/%s.png",pcVar10);
          ImgInfo.m_pEditor = this->m_pEditor;
          ImgInfo.m_Texture.m_Id = -1;
          ImgInfo.m_External = 0;
          ImgInfo.m_aName[0] = '\0';
          ImgInfo.super_CImageInfo.m_Width = 0;
          ImgInfo.super_CImageInfo.m_Height = 0;
          ImgInfo.super_CImageInfo.m_pData = (void *)0x0;
          ImgInfo.super_CImageInfo.m_Format = 0;
          ImgInfo.m_pAutoMapper = (IAutoMapper *)0x0;
          iVar7 = (*((ImgInfo.m_pEditor)->m_pGraphics->super_IInterface)._vptr_IInterface[0xe])
                            ((ImgInfo.m_pEditor)->m_pGraphics,&ImgInfo,aBuf);
          if (iVar7 != 0) {
            memcpy(pImg,&ImgInfo,0x1b0);
            pIVar3 = this->m_pEditor->m_pGraphics;
            iVar7 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
                              (pIVar3,ImgInfo.super_CImageInfo._0_8_ & 0xffffffff,
                               (ulong)ImgInfo.super_CImageInfo._0_8_ >> 0x20,
                               (ulong)(uint)ImgInfo.super_CImageInfo.m_Format,
                               ImgInfo.super_CImageInfo.m_pData,0xffffffffffffffff,8);
            (pImg->m_Texture).m_Id = iVar7;
            ImgInfo.super_CImageInfo.m_pData = (void *)0x0;
            pImg->m_External = 1;
          }
          CEditorImage::~CEditorImage(&ImgInfo);
        }
        if (pcVar10 != (char *)0x0) {
          str_copy(pImg->m_aName,pcVar10,0x80);
        }
        CEditorImage::LoadAutoMapper(pImg);
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::add(&this->m_lImages,&pImg);
        CDataFileReader::UnloadData(&DataFile,piVar9[5]);
        CDataFileReader::UnloadData(&DataFile,piVar9[4]);
      }
      CDataFileReader::GetType(&DataFile,5,(int *)aBuf,(int *)&ImgInfo);
      CDataFileReader::GetType(&DataFile,4,(int *)&pImg,&Start);
      for (iVar8 = 0; iVar8 < Start; iVar8 = iVar8 + 1) {
        piVar9 = (int *)CDataFileReader::GetItem(&DataFile,(int)pImg + iVar8,(int *)0x0,(int *)0x0);
        if (0xfffffffc < *piVar9 - 4U) {
          this_01 = NewGroup(this);
          iVar7 = piVar9[2];
          iVar19 = piVar9[3];
          iVar15 = piVar9[4];
          this_01->m_OffsetX = piVar9[1];
          this_01->m_OffsetY = iVar7;
          this_01->m_ParallaxX = iVar19;
          this_01->m_ParallaxY = iVar15;
          iVar7 = *piVar9;
          if (1 < iVar7) {
            iVar19 = piVar9[8];
            iVar15 = piVar9[9];
            iVar14 = piVar9[10];
            this_01->m_UseClipping = piVar9[7];
            this_01->m_ClipX = iVar19;
            this_01->m_ClipY = iVar15;
            this_01->m_ClipW = iVar14;
            this_01->m_ClipH = piVar9[0xb];
            if (iVar7 != 2) {
              IntsToStr(piVar9 + 0xc,3,this_01->m_aName);
            }
          }
          for (iVar7 = 0; iVar7 < piVar9[6]; iVar7 = iVar7 + 1) {
            pvVar11 = CDataFileReader::GetItem
                                (&DataFile,aBuf._0_4_ + iVar7 + piVar9[5],(int *)0x0,(int *)0x0);
            if (pvVar11 != (void *)0x0) {
              if (*(int *)((long)pvVar11 + 4) == 3) {
                this_02 = (CLayerTiles *)operator_new(0x40);
                CLayerQuads::CLayerQuads((CLayerQuads *)this_02);
                (this_02->super_CLayer).m_pEditor = this->m_pEditor;
                iVar19 = *(int *)((long)pvVar11 + 0x18);
                iVar15 = -1;
                if (iVar19 < (this->m_lImages).num_elements) {
                  iVar15 = iVar19;
                }
                if (iVar19 < -1) {
                  iVar15 = -1;
                }
                (this_02->m_Texture).m_Id = iVar15;
                if (1 < *(int *)((long)pvVar11 + 0xc)) {
                  IntsToStr((int *)((long)pvVar11 + 0x1c),3,(this_02->super_CLayer).m_aName);
                }
                pvVar12 = CDataFileReader::GetDataSwapped(&DataFile,*(int *)((long)pvVar11 + 0x14));
                CLayerGroup::AddLayer(this_01,(CLayer *)this_02);
                array<CQuad,_allocator_default<CQuad>_>::set_size
                          ((array<CQuad,_allocator_default<CQuad>_> *)&this_02->m_Image,
                           *(int *)((long)pvVar11 + 0x10));
                mem_copy(((array<CQuad,_allocator_default<CQuad>_> *)&this_02->m_Image)->list,
                         pvVar12,*(int *)((long)pvVar11 + 0x10) * 0x98);
                CDataFileReader::UnloadData(&DataFile,*(int *)((long)pvVar11 + 0x14));
              }
              else {
                if (*(int *)((long)pvVar11 + 4) != 2) goto LAB_00195c93;
                if ((*(byte *)((long)pvVar11 + 0x18) & 1) == 0) {
                  this_02 = (CLayerTiles *)operator_new(0x80);
                  CLayerTiles::CLayerTiles
                            (this_02,*(int *)((long)pvVar11 + 0x10),*(int *)((long)pvVar11 + 0x14));
                  (this_02->super_CLayer).m_pEditor = this->m_pEditor;
                  uVar4 = *(undefined8 *)((long)pvVar11 + 0x1c);
                  uVar5 = *(undefined8 *)((long)pvVar11 + 0x24);
                  (this_02->m_Color).r = (int)uVar4;
                  (this_02->m_Color).g = (int)((ulong)uVar4 >> 0x20);
                  (this_02->m_Color).b = (int)uVar5;
                  (this_02->m_Color).a = (int)((ulong)uVar5 >> 0x20);
                  uVar4 = *(undefined8 *)((long)pvVar11 + 0x2c);
                  this_02->m_ColorEnv = (int)uVar4;
                  this_02->m_ColorEnvOffset = (int)((ulong)uVar4 >> 0x20);
                }
                else {
                  this_02 = (CLayerTiles *)operator_new(0x80);
                  CLayerGame::CLayerGame
                            ((CLayerGame *)this_02,*(int *)((long)pvVar11 + 0x10),
                             *(int *)((long)pvVar11 + 0x14));
                  MakeGameLayer(this,(CLayer *)this_02);
                  MakeGameGroup(this,this_01);
                }
                CLayerGroup::AddLayer(this_01,&this_02->super_CLayer);
                pSavedTiles = (CTile *)CDataFileReader::GetData
                                                 (&DataFile,*(int *)((long)pvVar11 + 0x38));
                this_02->m_Image = *(int *)((long)pvVar11 + 0x34);
                this_02->m_Game = *(uint *)((long)pvVar11 + 0x18) & 1;
                if (*(int *)((long)pvVar11 + 0xc) < 3) {
LAB_00195c18:
                  mem_copy(this_02->m_pTiles,pSavedTiles,this_02->m_Width * this_02->m_Height * 4);
                }
                else {
                  IntsToStr((int *)((long)pvVar11 + 0x3c),3,(this_02->super_CLayer).m_aName);
                  if (*(int *)((long)pvVar11 + 0xc) < 4) goto LAB_00195c18;
                  CLayerTiles::ExtractTiles(this_02,pSavedTiles);
                }
                if ((this_02->m_Game != 0) && (*(int *)((long)pvVar11 + 0xc) == 0x10048)) {
                  uVar23 = this_02->m_Height * this_02->m_Width;
                  uVar13 = (ulong)uVar23;
                  if ((int)uVar23 < 1) {
                    uVar13 = 0;
                  }
                  for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
                    uVar1 = this_02->m_pTiles[uVar16].m_Index;
                    if (uVar1 != '\0') {
                      this_02->m_pTiles[uVar16].m_Index = uVar1 + 0xbf;
                    }
                  }
                }
                CDataFileReader::UnloadData(&DataFile,*(int *)((long)pvVar11 + 0x38));
              }
              (this_02->super_CLayer).m_Flags = *(int *)((long)pvVar11 + 8);
            }
LAB_00195c93:
          }
        }
      }
      CDataFileReader::GetType(&DataFile,6,(int *)aBuf,(int *)&ImgInfo);
      if (ImgInfo.super_CImageInfo.m_Width == 0) {
        local_418 = (void *)0x0;
      }
      else {
        local_418 = CDataFileReader::GetItem(&DataFile,aBuf._0_4_,(int *)0x0,(int *)0x0);
      }
      CDataFileReader::GetType(&DataFile,3,(int *)&ImgInfo,(int *)&pImg);
      for (iVar8 = 0; iVar8 < (int)pImg; iVar8 = iVar8 + 1) {
        piVar9 = (int *)CDataFileReader::GetItem
                                  (&DataFile,ImgInfo.super_CImageInfo.m_Width + iVar8,(int *)0x0,
                                   (int *)0x0);
        uVar13 = (ulong)(uint)piVar9[1];
        if (3 < piVar9[1]) {
          uVar13 = 4;
        }
        this_03 = (CEnvelope *)operator_new(0x48);
        CEnvelope::CEnvelope(this_03,(int)uVar13);
        aBuf._0_8_ = this_03;
        array<CEnvPoint,_allocator_default<CEnvPoint>_>::set_size(&this_03->m_lPoints,piVar9[3]);
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        lVar18 = 8;
        for (lVar20 = 0; lVar20 < piVar9[3]; lVar20 = lVar20 + 1) {
          iVar7 = piVar9[2];
          iVar19 = (int)lVar20;
          if (*piVar9 < 3) {
            mem_zero((void *)(*(long *)(aBuf._0_8_ + 8) + lVar20 * 0x58),0x58);
            lVar17 = *(long *)(aBuf._0_8_ + 8);
            *(undefined8 *)(lVar17 + lVar20 * 0x58) =
                 *(undefined8 *)((long)local_418 + (long)(iVar7 + iVar19) * 0x18);
            for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
              *(undefined4 *)(lVar17 + lVar18 + uVar16 * 4) =
                   *(undefined4 *)((long)local_418 + uVar16 * 4 + (long)(iVar7 + iVar19) * 0x18 + 8)
              ;
            }
          }
          else {
            puVar21 = (undefined4 *)((long)(iVar7 + iVar19) * 0x58 + (long)local_418);
            puVar22 = (undefined4 *)(lVar20 * 0x58 + *(long *)(aBuf._0_8_ + 8));
            for (lVar17 = 0x16; lVar17 != 0; lVar17 = lVar17 + -1) {
              *puVar22 = *puVar21;
              puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
              puVar22 = puVar22 + (ulong)bVar24 * -2 + 1;
            }
          }
          lVar18 = lVar18 + 0x58;
        }
        if (piVar9[4] != -1) {
          IntsToStr(piVar9 + 4,8,(char *)(aBuf._0_8_ + 0x18));
        }
        array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::add
                  (&this->m_lEnvelopes,(CEnvelope **)aBuf);
        if (1 < *piVar9) {
          *(bool *)(aBuf._0_8_ + 0x40) = piVar9[0xc] != 0;
        }
      }
      iVar8 = 1;
    }
  }
  CDataFileReader::~CDataFileReader(&DataFile);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

int CEditorMap::Load(class IStorage *pStorage, const char *pFileName, int StorageType)
{
	CDataFileReader DataFile;
	if(!DataFile.Open(pStorage, pFileName, StorageType))
		return 0;

	Clean();

	// check version
	CMapItemVersion *pItem = (CMapItemVersion *)DataFile.FindItem(MAPITEMTYPE_VERSION, 0);
	if(!pItem)
	{
		return 0;
	}
	else if(pItem->m_Version == CMapItemVersion::CURRENT_VERSION)
	{
		// load map info
		{
			CMapItemInfo *pItem = (CMapItemInfo *)DataFile.FindItem(MAPITEMTYPE_INFO, 0);
			if(pItem && pItem->m_Version == 1)
			{
				if(pItem->m_Author > -1)
					str_copy(m_MapInfo.m_aAuthor, (char *)DataFile.GetData(pItem->m_Author), sizeof(m_MapInfo.m_aAuthor));
				if(pItem->m_MapVersion > -1)
					str_copy(m_MapInfo.m_aVersion, (char *)DataFile.GetData(pItem->m_MapVersion), sizeof(m_MapInfo.m_aVersion));
				if(pItem->m_Credits > -1)
					str_copy(m_MapInfo.m_aCredits, (char *)DataFile.GetData(pItem->m_Credits), sizeof(m_MapInfo.m_aCredits));
				if(pItem->m_License > -1)
					str_copy(m_MapInfo.m_aLicense, (char *)DataFile.GetData(pItem->m_License), sizeof(m_MapInfo.m_aLicense));
			}
		}

		// load images
		{
			int Start, Num;
			DataFile.GetType( MAPITEMTYPE_IMAGE, &Start, &Num);
			for(int i = 0; i < Num; i++)
			{
				CMapItemImage *pItem = (CMapItemImage *)DataFile.GetItem(Start+i, 0, 0);
				char *pName = (char *)DataFile.GetData(pItem->m_ImageName);

				// copy base info
				CEditorImage *pImg = new CEditorImage(m_pEditor);
				pImg->m_External = pItem->m_External;

				if(pItem->m_External || (pItem->m_Version > 1 && pItem->m_Format != CImageInfo::FORMAT_RGB && pItem->m_Format != CImageInfo::FORMAT_RGBA))
				{
					char aBuf[IO_MAX_PATH_LENGTH];
					str_format(aBuf, sizeof(aBuf),"mapres/%s.png", pName);

					// load external
					CEditorImage ImgInfo(m_pEditor);
					if(m_pEditor->Graphics()->LoadPNG(&ImgInfo, aBuf, IStorage::TYPE_ALL))
					{
						*pImg = ImgInfo;
						pImg->m_Texture = m_pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
						ImgInfo.m_pData = 0;
						pImg->m_External = 1;
					}
				}
				else
				{
					pImg->m_Width = pItem->m_Width;
					pImg->m_Height = pItem->m_Height;
					pImg->m_Format = pItem->m_Version == 1 ? CImageInfo::FORMAT_RGBA : pItem->m_Format;

					// copy image data
					const int DataSize = pImg->m_Width * pImg->m_Height * pImg->GetPixelSize();
					void *pData = DataFile.GetData(pItem->m_ImageData);
					pImg->m_pData = mem_alloc(DataSize);
					mem_copy(pImg->m_pData, pData, DataSize);
					pImg->m_Texture = m_pEditor->Graphics()->LoadTextureRaw(pImg->m_Width, pImg->m_Height, pImg->m_Format, pImg->m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
				}

				// copy image name
				if(pName)
					str_copy(pImg->m_aName, pName, 128);

				// load auto mapper file
				pImg->LoadAutoMapper();

				m_lImages.add(pImg);

				// unload image
				DataFile.UnloadData(pItem->m_ImageData);
				DataFile.UnloadData(pItem->m_ImageName);
			}
		}

		// load groups
		{
			int LayersStart, LayersNum;
			DataFile.GetType(MAPITEMTYPE_LAYER, &LayersStart, &LayersNum);

			int Start, Num;
			DataFile.GetType(MAPITEMTYPE_GROUP, &Start, &Num);
			for(int g = 0; g < Num; g++)
			{
				CMapItemGroup *pGItem = (CMapItemGroup *)DataFile.GetItem(Start+g, 0, 0);

				if(pGItem->m_Version < 1 || pGItem->m_Version > CMapItemGroup::CURRENT_VERSION)
					continue;

				CLayerGroup *pGroup = NewGroup();
				pGroup->m_ParallaxX = pGItem->m_ParallaxX;
				pGroup->m_ParallaxY = pGItem->m_ParallaxY;
				pGroup->m_OffsetX = pGItem->m_OffsetX;
				pGroup->m_OffsetY = pGItem->m_OffsetY;

				if(pGItem->m_Version >= 2)
				{
					pGroup->m_UseClipping = pGItem->m_UseClipping;
					pGroup->m_ClipX = pGItem->m_ClipX;
					pGroup->m_ClipY = pGItem->m_ClipY;
					pGroup->m_ClipW = pGItem->m_ClipW;
					pGroup->m_ClipH = pGItem->m_ClipH;
				}

				// load group name
				if(pGItem->m_Version >= 3)
					IntsToStr(pGItem->m_aName, sizeof(pGroup->m_aName)/sizeof(int), pGroup->m_aName);

				for(int l = 0; l < pGItem->m_NumLayers; l++)
				{
					CLayer *pLayer = 0;
					CMapItemLayer *pLayerItem = (CMapItemLayer *)DataFile.GetItem(LayersStart+pGItem->m_StartLayer+l, 0, 0);
					if(!pLayerItem)
						continue;

					if(pLayerItem->m_Type == LAYERTYPE_TILES)
					{
						CMapItemLayerTilemap *pTilemapItem = (CMapItemLayerTilemap *)pLayerItem;
						CLayerTiles *pTiles = 0;

						if(pTilemapItem->m_Flags&TILESLAYERFLAG_GAME)
						{
							pTiles = new CLayerGame(pTilemapItem->m_Width, pTilemapItem->m_Height);
							MakeGameLayer(pTiles);
							MakeGameGroup(pGroup);
						}
						else
						{
							pTiles = new CLayerTiles(pTilemapItem->m_Width, pTilemapItem->m_Height);
							pTiles->m_pEditor = m_pEditor;
							pTiles->m_Color = pTilemapItem->m_Color;
							pTiles->m_ColorEnv = pTilemapItem->m_ColorEnv;
							pTiles->m_ColorEnvOffset = pTilemapItem->m_ColorEnvOffset;
						}

						pLayer = pTiles;

						pGroup->AddLayer(pTiles);
						void *pData = DataFile.GetData(pTilemapItem->m_Data);
						pTiles->m_Image = pTilemapItem->m_Image;
						pTiles->m_Game = pTilemapItem->m_Flags&TILESLAYERFLAG_GAME;

						// load layer name
						if(pTilemapItem->m_Version >= 3)
							IntsToStr(pTilemapItem->m_aName, sizeof(pTiles->m_aName)/sizeof(int), pTiles->m_aName);

						// get tile data
						if(pTilemapItem->m_Version > 3)
							pTiles->ExtractTiles((CTile *)pData);
						else
							mem_copy(pTiles->m_pTiles, pData, pTiles->m_Width*pTiles->m_Height*sizeof(CTile));


						if(pTiles->m_Game && pTilemapItem->m_Version == MakeVersion(1, *pTilemapItem))
						{
							for(int i = 0; i < pTiles->m_Width*pTiles->m_Height; i++)
							{
								if(pTiles->m_pTiles[i].m_Index)
									pTiles->m_pTiles[i].m_Index += ENTITY_OFFSET;
							}
						}

						DataFile.UnloadData(pTilemapItem->m_Data);
					}
					else if(pLayerItem->m_Type == LAYERTYPE_QUADS)
					{
						CMapItemLayerQuads *pQuadsItem = (CMapItemLayerQuads *)pLayerItem;
						CLayerQuads *pQuads = new CLayerQuads;
						pQuads->m_pEditor = m_pEditor;
						pLayer = pQuads;
						pQuads->m_Image = pQuadsItem->m_Image;
						if(pQuads->m_Image < -1 || pQuads->m_Image >= m_lImages.size())
							pQuads->m_Image = -1;

						// load layer name
						if(pQuadsItem->m_Version >= 2)
							IntsToStr(pQuadsItem->m_aName, sizeof(pQuads->m_aName)/sizeof(int), pQuads->m_aName);

						void *pData = DataFile.GetDataSwapped(pQuadsItem->m_Data);
						pGroup->AddLayer(pQuads);
						pQuads->m_lQuads.set_size(pQuadsItem->m_NumQuads);
						mem_copy(pQuads->m_lQuads.base_ptr(), pData, sizeof(CQuad)*pQuadsItem->m_NumQuads);
						DataFile.UnloadData(pQuadsItem->m_Data);
					}

					if(pLayer)
						pLayer->m_Flags = pLayerItem->m_Flags;
				}
			}
		}

		// load envelopes
		{
			CEnvPoint *pEnvPoints = 0;
			{
				int Start, Num;
				DataFile.GetType(MAPITEMTYPE_ENVPOINTS, &Start, &Num);
				if(Num)
					pEnvPoints = (CEnvPoint *)DataFile.GetItem(Start, 0, 0);
			}

			int Start, Num;
			DataFile.GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);
			for(int e = 0; e < Num; e++)
			{
				CMapItemEnvelope *pItem = (CMapItemEnvelope *)DataFile.GetItem(Start+e, 0, 0);
				const int Channels = minimum(pItem->m_Channels, 4);
				CEnvelope *pEnv = new CEnvelope(Channels);
				pEnv->m_lPoints.set_size(pItem->m_NumPoints);
				for(int n = 0; n < pItem->m_NumPoints; n++)
				{
					if(pItem->m_Version >= 3)
					{
						pEnv->m_lPoints[n] = pEnvPoints[pItem->m_StartPoint + n];
					}
					else
					{
						// backwards compatibility
						CEnvPoint_v1 *pEnvPoint_v1 = &((CEnvPoint_v1 *)pEnvPoints)[pItem->m_StartPoint + n];
						mem_zero((void*)&pEnv->m_lPoints[n], sizeof(CEnvPoint));

						pEnv->m_lPoints[n].m_Time = pEnvPoint_v1->m_Time;
						pEnv->m_lPoints[n].m_Curvetype = pEnvPoint_v1->m_Curvetype;

						for(int c = 0; c < Channels; c++)
						{
							pEnv->m_lPoints[n].m_aValues[c] = pEnvPoint_v1->m_aValues[c];
						}
					}
				}

				if(pItem->m_aName[0] != -1)	// compatibility with old maps
					IntsToStr(pItem->m_aName, sizeof(pItem->m_aName)/sizeof(int), pEnv->m_aName);
				m_lEnvelopes.add(pEnv);
				if(pItem->m_Version >= 2)
					pEnv->m_Synchronized = pItem->m_Synchronized;
			}
		}
	}
	else
		return 0;

	return 1;
}